

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SetJoinExpr(Expr *p,int iTable,u32 joinFlag)

{
  ExprList *pEVar1;
  long lVar2;
  long lVar3;
  
  if (p != (Expr *)0x0) {
    do {
      p->flags = p->flags | joinFlag;
      (p->w).iJoin = iTable;
      if (((p->op == 0xac) && ((p->x).pList != (ExprList *)0x0)) &&
         (pEVar1 = (p->x).pList, 0 < pEVar1->nExpr)) {
        lVar3 = 8;
        lVar2 = 0;
        do {
          sqlite3SetJoinExpr(*(Expr **)((long)pEVar1->a + lVar3 + -8),iTable,joinFlag);
          lVar2 = lVar2 + 1;
          pEVar1 = (p->x).pList;
          lVar3 = lVar3 + 0x18;
        } while (lVar2 < pEVar1->nExpr);
      }
      sqlite3SetJoinExpr(p->pLeft,iTable,joinFlag);
      p = p->pRight;
    } while (p != (Expr *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SetJoinExpr(Expr *p, int iTable, u32 joinFlag){
  assert( joinFlag==EP_OuterON || joinFlag==EP_InnerON );
  while( p ){
    ExprSetProperty(p, joinFlag);
    assert( !ExprHasProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(p, EP_NoReduce);
    p->w.iJoin = iTable;
    if( p->op==TK_FUNCTION ){
      assert( ExprUseXList(p) );
      if( p->x.pList ){
        int i;
        for(i=0; i<p->x.pList->nExpr; i++){
          sqlite3SetJoinExpr(p->x.pList->a[i].pExpr, iTable, joinFlag);
        }
      }
    }
    sqlite3SetJoinExpr(p->pLeft, iTable, joinFlag);
    p = p->pRight;
  }
}